

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QVariant * __thiscall QWidget::inputMethodQuery(QWidget *this,InputMethodQuery query)

{
  int iVar1;
  Int IVar2;
  int in_EDX;
  QWidget *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  int in_stack_ffffffffffffff98;
  QWidgetPrivate *pQVar4;
  QRect *local_44;
  QWidgetPrivate *this_00;
  QFlagsStorageHelper<Qt::InputMethodHint,_4> local_1c;
  QRect *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  if (in_EDX == 2) {
    iVar1 = width((QWidget *)0x37d249);
    iVar1 = iVar1 / 2;
    height((QWidget *)0x37d25f);
    QRect::QRect((QRect *)pQVar4,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,iVar1,
                 in_stack_ffffffffffffff98);
    ::QVariant::QVariant((QVariant *)in_RDI,local_18);
  }
  else if (in_EDX == 4) {
    font(in_RSI);
    QFont::operator_cast_to_QVariant((QFont *)in_RDI);
  }
  else if (in_EDX == 0x80) {
    (**(code **)(*(long *)in_RSI + 400))(in_RDI,in_RSI,8);
    pQVar4 = in_RDI;
  }
  else if (in_EDX == 0x100) {
    local_1c.super_QFlagsStorage<Qt::InputMethodHint>.i =
         (QFlagsStorage<Qt::InputMethodHint>)inputMethodHints((QWidget *)in_RDI);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
    ::QVariant::QVariant((QVariant *)in_RDI,IVar2);
  }
  else if (in_EDX == 0x8000) {
    this_00 = in_RDI;
    d_func((QWidget *)0x37d2f3);
    QVar3 = QWidgetPrivate::clipRect(this_00);
    local_44 = QVar3._0_8_;
    ::QVariant::QVariant((QVariant *)in_RDI,local_44);
  }
  else {
    ::QVariant::QVariant((QVariant *)0x37d325);
    pQVar4 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QVariant *)pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QWidget::inputMethodQuery(Qt::InputMethodQuery query) const
{
    switch(query) {
    case Qt::ImCursorRectangle:
        return QRect(width()/2, 0, 1, height());
    case Qt::ImFont:
        return font();
    case Qt::ImAnchorPosition:
        // Fallback.
        return inputMethodQuery(Qt::ImCursorPosition);
    case Qt::ImHints:
        return (int)inputMethodHints();
    case Qt::ImInputItemClipRectangle:
        return d_func()->clipRect();
    default:
        return QVariant();
    }
}